

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
TextReaderTest_InvalidNumOptions_Test::~TextReaderTest_InvalidNumOptions_Test
          (TextReaderTest_InvalidNumOptions_Test *this)

{
  void *in_RDI;
  
  ~TextReaderTest_InvalidNumOptions_Test((TextReaderTest_InvalidNumOptions_Test *)0x1a4de8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(TextReaderTest, InvalidNumOptions) {
  EXPECT_EQ(0, ReadHeader(0, "ga").num_ampl_options);
  EXPECT_EQ(0, ReadHeader(0, "g-1").num_ampl_options);
  EXPECT_THROW_MSG(ReadHeader(0, "g10"),
      ReadError, "(input):1:2: too many options");
  EXPECT_THROW_MSG(ReadHeader(0,
      fmt::format("g{}", static_cast<unsigned>(INT_MAX) + 1)),
      ReadError, "(input):1:2: number is too big");
}